

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_KillTracer(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *origin;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  AActor *source;
  AActor *inflictor;
  PClassActor *pPVar7;
  uint uVar8;
  int flags;
  int selector;
  VMValue *pVVar9;
  char *pcVar10;
  AActor *pAVar11;
  PClassActor *filter;
  int selector_00;
  int iVar12;
  bool bVar13;
  FName local_38;
  FName local_34;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_0065d2ce;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_0065d284:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0065d2ce:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  pVVar9 = param;
  uVar8 = numparam;
  if (origin != (AActor *)0x0) {
    if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar6 = (origin->super_DThinker).super_DObject.Class;
    bVar13 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar13;
    uVar8 = (uint)bVar13;
    pVVar9 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar13);
    if (pPVar6 != pPVar3 && !bVar13) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0065d2ce;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_0065d284;
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar5 = (**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
        puVar2[1] = uVar5;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar13 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar3 && bVar13) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar13 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar13) {
        pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0065d2ce;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_0065d2ce;
  }
  iVar4 = 0;
  if (3 < numparam) {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar4 = param[3].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x193a,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  flags = 0;
  if (4 < numparam) {
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      flags = param[4].field_0.i;
    }
    else {
      flags = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193b,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
  }
  if ((5 < numparam) && (VVar1 = param[5].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[5].field_0.field_1.atag != 1 && (param[5].field_0.field_1.a != (void *)0x0)))) {
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
LAB_0065d2af:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x193c,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    filter = (PClassActor *)param[5].field_0.field_1.a;
    if (filter != (PClassActor *)0x0) {
      pPVar7 = filter;
      if (filter != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
          if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar7 != (PClassActor *)0x0);
        if (pPVar7 == (PClassActor *)0x0) {
          pcVar10 = "filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_0065d2af;
        }
      }
      goto LAB_0065d12d;
    }
  }
  filter = (PClassActor *)0x0;
LAB_0065d12d:
  iVar12 = 0;
  if (6 < numparam) {
    VVar1 = param[6].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar12 = param[6].field_0.i;
    }
    else {
      iVar12 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193d,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
  }
  selector_00 = 0;
  selector = 0;
  if (7 < numparam) {
    VVar1 = param[7].field_0.field_3.Type;
    if (VVar1 == '\0') {
      selector = param[7].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x193e,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (8 < numparam) {
    VVar1 = param[8].field_0.field_3.Type;
    if (VVar1 == '\0') {
      selector_00 = param[8].field_0.i;
    }
    else {
      selector_00 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193f,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
  }
  source = COPY_AAPTR(origin,selector);
  inflictor = COPY_AAPTR(origin,selector_00);
  pAVar11 = (origin->tracer).field_0.p;
  if (pAVar11 != (AActor *)0x0) {
    if (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar11 = (origin->tracer).field_0.p;
      if ((pAVar11 != (AActor *)0x0) &&
         (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (origin->tracer).field_0.p = (AActor *)0x0;
        pAVar11 = (AActor *)0x0;
      }
      local_38.Index = iVar12;
      local_34.Index = iVar4;
      DoKill(pAVar11,inflictor,source,&local_34,flags,filter,&local_38);
    }
    else {
      (origin->tracer).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillTracer)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->tracer != NULL)
		DoKill(self->tracer, inflictor, source, damagetype, flags, filter, species);
	return 0;
}